

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>_>
::expand(Stack<std::unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>_>
         *this)

{
  unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  *puVar1;
  unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  *puVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
            *)Lib::alloc(sVar7 * 8);
  uVar4 = this->_capacity;
  if (uVar4 == 0) {
    sVar3 = 0;
  }
  else {
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      puVar1 = this->_stack;
      *(undefined8 *)
       ((long)&(puVar2->_M_t).
               super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
               .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl + lVar5)
           = *(undefined8 *)
              ((long)&(puVar1->_M_t).
                      super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl +
              lVar5);
      *(undefined8 *)
       ((long)&(puVar1->_M_t).
               super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
               .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl + lVar5)
           = 0;
      std::
      unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
      ::~unique_ptr((unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                     *)((long)&(this->_stack->_M_t).
                               super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                               .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>.
                               _M_head_impl + lVar5));
      uVar4 = this->_capacity;
      lVar5 = lVar5 + 8;
    }
    Lib::free(this->_stack);
    sVar3 = this->_capacity;
  }
  this->_stack = puVar2;
  this->_cursor = puVar2 + sVar3;
  this->_end = puVar2 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }